

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slgh_compile.cc
# Opt level: O0

bool __thiscall
ConsistencyChecker::checkSectionTruncations
          (ConsistencyChecker *this,Constructor *ct,ConstructTpl *cttpl,bool isbigendian)

{
  OpTpl *this_00;
  bool bVar1;
  int4 iVar2;
  reference ppOVar3;
  VarnodeTpl *pVVar4;
  int local_64;
  int4 i;
  VarnodeTpl *outvn;
  OpTpl *op;
  OpTpl **local_48;
  byte local_39;
  vector<OpTpl_*,_std::allocator<OpTpl_*>_> *pvStack_38;
  bool testresult;
  vector<OpTpl_*,_std::allocator<OpTpl_*>_> *ops;
  const_iterator iter;
  bool isbigendian_local;
  ConstructTpl *cttpl_local;
  Constructor *ct_local;
  ConsistencyChecker *this_local;
  
  iter._M_current._7_1_ = isbigendian;
  __gnu_cxx::__normal_iterator<OpTpl_*const_*,_std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>_>::
  __normal_iterator((__normal_iterator<OpTpl_*const_*,_std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>_>
                     *)&ops);
  pvStack_38 = ConstructTpl::getOpvec(cttpl);
  local_39 = 1;
  local_48 = (OpTpl **)std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>::begin(pvStack_38);
  ops = (vector<OpTpl_*,_std::allocator<OpTpl_*>_> *)local_48;
  while( true ) {
    op = (OpTpl *)std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>::end(pvStack_38);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<OpTpl_*const_*,_std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>_>
                        *)&ops,(__normal_iterator<OpTpl_*const_*,_std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>_>
                                *)&op);
    if (!bVar1) break;
    ppOVar3 = __gnu_cxx::
              __normal_iterator<OpTpl_*const_*,_std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>_>::
              operator*((__normal_iterator<OpTpl_*const_*,_std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>_>
                         *)&ops);
    this_00 = *ppOVar3;
    pVVar4 = OpTpl::getOut(this_00);
    if ((pVVar4 != (VarnodeTpl *)0x0) &&
       (bVar1 = checkVarnodeTruncation(this,ct,-1,this_00,pVVar4,(bool)(iter._M_current._7_1_ & 1)),
       !bVar1)) {
      local_39 = 0;
    }
    for (local_64 = 0; iVar2 = OpTpl::numInput(this_00), local_64 < iVar2; local_64 = local_64 + 1)
    {
      pVVar4 = OpTpl::getIn(this_00,local_64);
      bVar1 = checkVarnodeTruncation
                        (this,ct,local_64,this_00,pVVar4,(bool)(iter._M_current._7_1_ & 1));
      if (!bVar1) {
        local_39 = 0;
      }
    }
    __gnu_cxx::__normal_iterator<OpTpl_*const_*,_std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>_>::
    operator++((__normal_iterator<OpTpl_*const_*,_std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>_> *
               )&ops);
  }
  return (bool)(local_39 & 1);
}

Assistant:

bool ConsistencyChecker::checkSectionTruncations(Constructor *ct,ConstructTpl *cttpl,bool isbigendian)

{ // Check all the varnodes that have an offset_plus template
  //     adjust the plus if we are bigendian
  //     make sure the truncation is valid
  vector<OpTpl *>::const_iterator iter;
  const vector<OpTpl *> &ops(cttpl->getOpvec());
  bool testresult = true;
  
  for(iter=ops.begin();iter!=ops.end();++iter) {
    OpTpl *op = *iter;
    VarnodeTpl *outvn = op->getOut();
    if (outvn != (VarnodeTpl *)0) {
      if (!checkVarnodeTruncation(ct,-1,op,outvn,isbigendian))
	testresult = false;
    }
    for(int4 i=0;i<op->numInput();++i) {
      if (!checkVarnodeTruncation(ct,i,op,op->getIn(i),isbigendian))
	testresult = false;
    }
  }
  return testresult;
}